

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool __thiscall
tinyobj::MaterialStreamReader::operator()
          (MaterialStreamReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *warn,string *err)

{
  uint uVar1;
  istream *inStream;
  char cVar2;
  stringstream local_1c8 [8];
  stringstream ss;
  long local_1b8 [14];
  ios_base local_148 [264];
  long *local_40;
  long local_30 [2];
  
  inStream = this->m_inStream;
  uVar1 = *(uint *)(inStream + *(long *)(*(long *)inStream + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    LoadMtl(matMap,materials,inStream,warn,warn);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1b8,"Material stream in error state. ",0x20);
    cVar2 = (char)(ostream *)local_1b8;
    std::ios::widen((char)*(undefined8 *)(local_1b8[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    if (warn != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)warn,(ulong)local_40);
      if (local_40 != local_30) {
        operator_delete(local_40,local_30[0] + 1);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1c8);
    std::ios_base::~ios_base(local_148);
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool MaterialStreamReader::operator()(const std::string &matId,
                                      std::vector<material_t> *materials,
                                      std::map<std::string, int> *matMap,
                                      std::string *warn, std::string *err) {
  (void)err;
  (void)matId;
  if (!m_inStream) {
    std::stringstream ss;
    ss << "Material stream in error state. " << std::endl;
    if (warn) {
      (*warn) += ss.str();
    }
    return false;
  }

  LoadMtl(matMap, materials, &m_inStream, warn, err);

  return true;
}